

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

SUNErrCode SUNLinSol_SPBCGSSetMaxl(SUNLinearSolver S,int maxl)

{
  int iVar1;
  
  iVar1 = 5;
  if (0 < maxl) {
    iVar1 = maxl;
  }
  *(int *)S->content = iVar1;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_SPBCGSSetMaxl(SUNLinearSolver S, int maxl)
{
  SUNFunctionBegin(S->sunctx);

  /* Check for legal pretype */
  if (maxl <= 0) { maxl = SUNSPBCGS_MAXL_DEFAULT; }

  /* Set pretype */
  SPBCGS_CONTENT(S)->maxl = maxl;
  return SUN_SUCCESS;
}